

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O0

int Aig_ManCheck(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  int local_2c;
  int i;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_2c);
    pAVar12 = Aig_ObjFanin0(pAVar11);
    if ((pAVar12 != (Aig_Obj_t *)0x0) ||
       (pAVar12 = Aig_ObjFanin1(pAVar11), pAVar12 != (Aig_Obj_t *)0x0)) {
      printf("Aig_ManCheck: The PI node \"%p\" has fanins.\n",pAVar11);
      return 0;
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCos), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
    pAVar12 = Aig_ObjFanin0(pAVar11);
    if (pAVar12 == (Aig_Obj_t *)0x0) {
      printf("Aig_ManCheck: The PO node \"%p\" has NULL fanin.\n",pAVar11);
      return 0;
    }
    pAVar12 = Aig_ObjFanin1(pAVar11);
    if (pAVar12 != (Aig_Obj_t *)0x0) {
      printf("Aig_ManCheck: The PO node \"%p\" has second fanin.\n",pAVar11);
      return 0;
    }
  }
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_2c) {
      iVar1 = Aig_ManObjNum(p);
      iVar2 = Aig_ManCiNum(p);
      iVar3 = Aig_ManCoNum(p);
      iVar4 = Aig_ManBufNum(p);
      iVar5 = Aig_ManAndNum(p);
      iVar6 = Aig_ManExorNum(p);
      if (iVar1 == iVar2 + 1 + iVar3 + iVar4 + iVar5 + iVar6) {
        iVar1 = Aig_TableCountEntries(p);
        iVar2 = Aig_ManAndNum(p);
        iVar3 = Aig_ManExorNum(p);
        if (iVar1 == iVar2 + iVar3) {
          p_local._4_4_ = 1;
        }
        else {
          printf("Aig_ManCheck: The number of nodes in the structural hashing table is wrong.\n");
          uVar7 = Aig_TableCountEntries(p);
          uVar8 = Aig_ManAndNum(p);
          uVar9 = Aig_ManExorNum(p);
          iVar1 = Aig_ManAndNum(p);
          iVar2 = Aig_ManExorNum(p);
          printf("Entries = %d. And = %d. Xor = %d. Total = %d.\n",(ulong)uVar7,(ulong)uVar8,
                 (ulong)uVar9,(ulong)(uint)(iVar1 + iVar2));
          p_local._4_4_ = 0;
        }
      }
      else {
        printf("Aig_ManCheck: The number of created nodes is wrong.\n");
        uVar7 = Aig_ManCiNum(p);
        uVar8 = Aig_ManCoNum(p);
        uVar9 = Aig_ManBufNum(p);
        uVar10 = Aig_ManAndNum(p);
        iVar1 = Aig_ManExorNum(p);
        iVar2 = Aig_ManCiNum(p);
        iVar3 = Aig_ManCoNum(p);
        iVar4 = Aig_ManBufNum(p);
        iVar5 = Aig_ManAndNum(p);
        iVar6 = Aig_ManExorNum(p);
        printf("C1 = %d. Pi = %d. Po = %d. Buf = %d. And = %d. Xor = %d. Total = %d.\n",1,
               (ulong)uVar7,(ulong)uVar8,(ulong)uVar9,(ulong)uVar10,iVar1,
               iVar2 + 1 + iVar3 + iVar4 + iVar5 + iVar6);
        uVar8 = Aig_ManObjNumMax(p);
        uVar7 = p->nDeleted;
        uVar9 = Aig_ManObjNum(p);
        printf("Created = %d. Deleted = %d. Existing = %d.\n",(ulong)uVar8,(ulong)uVar7,(ulong)uVar9
              );
        p_local._4_4_ = 0;
      }
      return p_local._4_4_;
    }
    pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if ((pAVar11 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar11), iVar1 != 0)) {
      pAVar12 = Aig_ObjFanin0(pAVar11);
      if ((pAVar12 == (Aig_Obj_t *)0x0) ||
         (pAVar12 = Aig_ObjFanin1(pAVar11), pAVar12 == (Aig_Obj_t *)0x0)) {
        printf("Aig_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n",pAVar11);
        return 0;
      }
      pAVar12 = Aig_ObjFanin0(pAVar11);
      iVar1 = pAVar12->Id;
      pAVar12 = Aig_ObjFanin1(pAVar11);
      if (pAVar12->Id <= iVar1) {
        printf("Aig_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n",pAVar11);
        return 0;
      }
      pAVar12 = Aig_TableLookup(p,pAVar11);
      if (pAVar12 != pAVar11) {
        printf("Aig_ManCheck: Node \"%p\" is not in the structural hashing table.\n",pAVar11);
        return 0;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManCheck( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pObj2;
    int i;
    // check primary inputs
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) || Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The PI node \"%p\" has fanins.\n", pObj );
            return 0;
        }
    }
    // check primary outputs
    Aig_ManForEachCo( p, pObj, i )
    {
        if ( !Aig_ObjFanin0(pObj) )
        {
            printf( "Aig_ManCheck: The PO node \"%p\" has NULL fanin.\n", pObj );
            return 0;
        }
        if ( Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The PO node \"%p\" has second fanin.\n", pObj );
            return 0;
        }
    }
    // check internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( !Aig_ObjFanin0(pObj) || !Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n", pObj );
            return 0;
        }
        if ( Aig_ObjFanin0(pObj)->Id >= Aig_ObjFanin1(pObj)->Id )
        {
            printf( "Aig_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n", pObj );
            return 0;
        }
        pObj2 = Aig_TableLookup( p, pObj );
        if ( pObj2 != pObj )
        {
            printf( "Aig_ManCheck: Node \"%p\" is not in the structural hashing table.\n", pObj );
            return 0;
        }
    }
    // count the total number of nodes
    if ( Aig_ManObjNum(p) != 1 + Aig_ManCiNum(p) + Aig_ManCoNum(p) + 
        Aig_ManBufNum(p) + Aig_ManAndNum(p) + Aig_ManExorNum(p) )
    {
        printf( "Aig_ManCheck: The number of created nodes is wrong.\n" );
        printf( "C1 = %d. Pi = %d. Po = %d. Buf = %d. And = %d. Xor = %d. Total = %d.\n",
            1, Aig_ManCiNum(p), Aig_ManCoNum(p), Aig_ManBufNum(p), Aig_ManAndNum(p), Aig_ManExorNum(p), 
            1 + Aig_ManCiNum(p) + Aig_ManCoNum(p) + Aig_ManBufNum(p) + Aig_ManAndNum(p) + Aig_ManExorNum(p) );
        printf( "Created = %d. Deleted = %d. Existing = %d.\n",
            Aig_ManObjNumMax(p), p->nDeleted, Aig_ManObjNum(p) );
        return 0;
    }
    // count the number of nodes in the table
    if ( Aig_TableCountEntries(p) != Aig_ManAndNum(p) + Aig_ManExorNum(p) )
    {
        printf( "Aig_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        printf( "Entries = %d. And = %d. Xor = %d. Total = %d.\n", 
            Aig_TableCountEntries(p), Aig_ManAndNum(p), Aig_ManExorNum(p), 
            Aig_ManAndNum(p) + Aig_ManExorNum(p) );

        return 0;
    }
//    if ( !Aig_ManIsAcyclic(p) )
//        return 0;
    return 1; 
}